

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SendBuffer.h
# Opt level: O2

void __thiscall SendBuffer::load_bytes(SendBuffer *this,char *source,int bytes)

{
  ulong uVar1;
  Error *this_00;
  ulong uVar2;
  
  if ((ulong)(long)bytes <= (this->buf)._M_string_length) {
    uVar1 = 0;
    uVar2 = 0;
    if (0 < bytes) {
      uVar2 = (ulong)(uint)bytes;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      (this->buf)._M_dataplus._M_p[uVar1] = source[uVar1];
    }
    this->full = bytes;
    this->read = 0;
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"Too many bytes to read");
  __cxa_throw(this_00,&Error::typeinfo,std::exception::~exception);
}

Assistant:

void load_bytes(char *source, int bytes) {
    if (bytes > buf.size())
      throw Error("Too many bytes to read");
    for (int p = 0; p < bytes; ++p) {
      buf[p] = *(source + p);
    }
    full = bytes;
    read = 0;
  }